

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O1

void __thiscall icu_63::FCDUTF16CollationIterator::switchToForward(FCDUTF16CollationIterator *this)

{
  UChar *pUVar1;
  int8_t iVar2;
  
  if (this->checkDir < '\0') {
    pUVar1 = (this->super_UTF16CollationIterator).pos;
    this->segmentStart = pUVar1;
    (this->super_UTF16CollationIterator).start = pUVar1;
    if (pUVar1 != this->segmentLimit) {
      iVar2 = '\0';
      goto LAB_00238ba9;
    }
  }
  else if ((this->super_UTF16CollationIterator).start != this->segmentStart) {
    pUVar1 = this->segmentLimit;
    this->segmentStart = pUVar1;
    (this->super_UTF16CollationIterator).start = pUVar1;
    (this->super_UTF16CollationIterator).pos = pUVar1;
  }
  (this->super_UTF16CollationIterator).limit = this->rawLimit;
  iVar2 = '\x01';
LAB_00238ba9:
  this->checkDir = iVar2;
  return;
}

Assistant:

void
FCDUTF16CollationIterator::switchToForward() {
    U_ASSERT(checkDir < 0 || (checkDir == 0 && pos == limit));
    if(checkDir < 0) {
        // Turn around from backward checking.
        start = segmentStart = pos;
        if(pos == segmentLimit) {
            limit = rawLimit;
            checkDir = 1;  // Check forward.
        } else {  // pos < segmentLimit
            checkDir = 0;  // Stay in FCD segment.
        }
    } else {
        // Reached the end of the FCD segment.
        if(start == segmentStart) {
            // The input text segment is FCD, extend it forward.
        } else {
            // The input text segment needed to be normalized.
            // Switch to checking forward from it.
            pos = start = segmentStart = segmentLimit;
            // Note: If this segment is at the end of the input text,
            // then it might help to return FALSE to indicate that, so that
            // we do not have to re-check and normalize when we turn around and go backwards.
            // However, that would complicate the call sites for an optimization of an unusual case.
        }
        limit = rawLimit;
        checkDir = 1;
    }
}